

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadRelocSection(BinaryReader *this,Offset section_size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Result RVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  uint32_t value;
  uint32_t addend;
  uint32_t reloc_type;
  Index num_relocs;
  uint32_t section_index;
  uint local_44;
  uint32_t local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb2])();
  if (iVar3 == 0) {
    RVar4 = ReadU32Leb128(this,&local_34,"section index");
    if ((RVar4.enum_ != Error) &&
       (RVar4 = ReadCount(this,&local_38,"relocation count"), RVar4.enum_ != Error)) {
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb3])
                        (this->delegate_,(ulong)local_38,(ulong)local_34);
      uVar1 = local_38;
      if (iVar3 == 0) {
        for (; uVar1 != 0; uVar1 = uVar1 - 1) {
          local_40 = 0;
          RVar4 = ReadU32Leb128(this,&local_3c,"relocation type");
          if (RVar4.enum_ == Error) {
            return (Result)Error;
          }
          RVar4 = ReadU32Leb128(this,&local_44,"offset");
          uVar5 = (ulong)local_44;
          if (RVar4.enum_ == Error) {
            return (Result)Error;
          }
          RVar4 = ReadU32Leb128(this,&local_44,"index");
          uVar2 = local_44;
          if (RVar4.enum_ == Error) {
            return (Result)Error;
          }
          uVar7 = (ulong)local_3c;
          if (0x16 < uVar7) {
            if (local_3c < 0x17) {
              pcVar6 = *(char **)(g_reloc_type_name + uVar7 * 8);
            }
            else {
              pcVar6 = "<error_reloc_type>";
            }
            PrintError(this,"unknown reloc type: %s",pcVar6);
            return (Result)Error;
          }
          if (((0x63cb38U >> (local_3c & 0x1f) & 1) != 0) &&
             (RVar4 = ReadS32Leb128(this,&local_40,"addend"), RVar4.enum_ == Error)) {
            return (Result)Error;
          }
          iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb4])
                            (this->delegate_,uVar7,uVar5,uVar2,(ulong)local_40);
          if (iVar3 != 0) {
            pcVar6 = "OnReloc callback failed";
            goto LAB_00149e46;
          }
        }
        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb5])();
        if (iVar3 == 0) {
          return (Result)Ok;
        }
        pcVar6 = "EndRelocSection callback failed";
      }
      else {
        pcVar6 = "OnRelocCount callback failed";
      }
LAB_00149e46:
      PrintError(this,pcVar6);
    }
  }
  else {
    PrintError(this,"BeginRelocSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadRelocSection(Offset section_size) {
  CALLBACK(BeginRelocSection, section_size);
  uint32_t section_index;
  CHECK_RESULT(ReadU32Leb128(&section_index, "section index"));
  Index num_relocs;
  CHECK_RESULT(ReadCount(&num_relocs, "relocation count"));
  CALLBACK(OnRelocCount, num_relocs, section_index);
  for (Index i = 0; i < num_relocs; ++i) {
    Offset offset;
    Index index;
    uint32_t reloc_type, addend = 0;
    CHECK_RESULT(ReadU32Leb128(&reloc_type, "relocation type"));
    CHECK_RESULT(ReadOffset(&offset, "offset"));
    CHECK_RESULT(ReadIndex(&index, "index"));
    RelocType type = static_cast<RelocType>(reloc_type);
    switch (type) {
      case RelocType::MemoryAddressLEB:
      case RelocType::MemoryAddressLEB64:
      case RelocType::MemoryAddressSLEB:
      case RelocType::MemoryAddressSLEB64:
      case RelocType::MemoryAddressRelSLEB:
      case RelocType::MemoryAddressRelSLEB64:
      case RelocType::MemoryAddressI32:
      case RelocType::MemoryAddressI64:
      case RelocType::FunctionOffsetI32:
      case RelocType::SectionOffsetI32:
      case RelocType::MemoryAddressTLSSLEB:
      case RelocType::MemoryAddressTLSI32:
        CHECK_RESULT(ReadS32Leb128(&addend, "addend"));
        break;

      case RelocType::FuncIndexLEB:
      case RelocType::TableIndexSLEB:
      case RelocType::TableIndexSLEB64:
      case RelocType::TableIndexI32:
      case RelocType::TableIndexI64:
      case RelocType::TypeIndexLEB:
      case RelocType::GlobalIndexLEB:
      case RelocType::GlobalIndexI32:
      case RelocType::TagIndexLEB:
      case RelocType::TableIndexRelSLEB:
      case RelocType::TableNumberLEB:
        break;

      default:
        PrintError("unknown reloc type: %s", GetRelocTypeName(type));
        return Result::Error;
    }
    CALLBACK(OnReloc, type, offset, index, addend);
  }
  CALLBACK0(EndRelocSection);
  return Result::Ok;
}